

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo4.cpp
# Opt level: O0

int64_t primesum::pi_lmo4(int64_t x)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  long lVar1;
  int256_t *this;
  int256_t *this_00;
  int256_t *extraout_RDX;
  long in_RDI;
  double dVar2;
  undefined1 in_stack_00000000 [16];
  vector<int,_std::allocator<int>_> *in_stack_00000050;
  vector<int,_std::allocator<int>_> *in_stack_00000058;
  vector<int,_std::allocator<int>_> *in_stack_00000060;
  int64_t in_stack_00000068;
  int64_t in_stack_00000070;
  int64_t in_stack_00000078;
  int256_t sum;
  int256_t phi;
  int256_t s2;
  int256_t s1;
  vector<int,_std::allocator<int>_> primes;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  int256_t p2;
  int64_t c;
  int64_t y;
  int64_t x13;
  double alpha;
  int64_t in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  int256_t *in_stack_fffffffffffffdf8;
  int256_t *other;
  int256_t *in_stack_fffffffffffffe00;
  int64_t in_stack_fffffffffffffe28;
  int256_t *piVar3;
  int256_t *this_01;
  undefined8 in_stack_fffffffffffffe38;
  int256_t *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  int64_t in_stack_fffffffffffffe58;
  int64_t in_stack_fffffffffffffe68;
  int256_t local_128;
  long local_100;
  long local_70;
  int in_stack_ffffffffffffffb4;
  int64_t in_stack_ffffffffffffffb8;
  int threads;
  int64_t in_stack_fffffffffffffff8;
  int64_t iVar4;
  
  if (in_RDI < 2) {
    iVar4 = 0;
  }
  else {
    x_02._8_8_ = in_stack_fffffffffffffe58;
    x_02._0_8_ = in_stack_fffffffffffffe50;
    dVar2 = get_alpha_lmo((int128_t)x_02);
    lVar1 = iroot<3,long>((long)in_stack_fffffffffffffe00);
    lVar1 = (long)((double)lVar1 * dVar2);
    iVar4 = PhiTiny::get_c(in_stack_fffffffffffffde8);
    threads = (int)((ulong)dVar2 >> 0x20);
    local_70 = in_RDI >> 0x3f;
    x_03._8_8_ = lVar1;
    x_03._0_8_ = iVar4;
    P2((int128_t)x_03,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    generate_moebius(in_stack_fffffffffffffe58);
    generate_lpf(in_stack_fffffffffffffe58);
    generate_primes(in_stack_fffffffffffffe28);
    local_100 = in_RDI >> 0x3f;
    S1((int128_t)in_stack_00000000,in_stack_fffffffffffffff8,in_RDI,threads);
    this = (int256_t *)
           anon_unknown.dwarf_b3b5d::S2
                     (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                      in_stack_00000058,in_stack_00000050);
    x_00._8_8_ = in_stack_fffffffffffffdf0;
    x_00._0_8_ = in_stack_fffffffffffffde8;
    int256_t::int256_t<__int128,void>(&local_128,(__int128)x_00);
    int256_t::operator+(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    this_00 = (int256_t *)prime_sum_tiny(in_stack_fffffffffffffe68);
    x_01._8_8_ = in_stack_fffffffffffffe38;
    x_01._0_8_ = extraout_RDX;
    other = extraout_RDX;
    piVar3 = this_00;
    this_01 = extraout_RDX;
    int256_t::operator+(in_stack_fffffffffffffe48,(__int128)x_01);
    int256_t::operator-(this_01,(int)((ulong)piVar3 >> 0x20));
    int256_t::operator-(this_00,other);
    iVar4 = int256_t::operator_cast_to_long(this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  }
  return iVar4;
}

Assistant:

int64_t pi_lmo4(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}